

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void set_ext_params_cpy_exx(xc_func_type *p,double *ext_params)

{
  int iVar1;
  xc_func_type *in_RSI;
  double *in_RDI;
  int nparams;
  xc_func_type *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = *(int *)((long)*in_RDI + 0x50) + -1;
  copy_params(unaff_retaddr,in_RDI,(int)((ulong)in_RSI >> 0x20));
  set_ext_params_exx(in_RSI,(double *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

void
set_ext_params_cpy_exx(xc_func_type *p, const double *ext_params)
{
  int nparams;
  assert(p != NULL);
  nparams = p->info->ext_params.n - 1;
  copy_params(p, ext_params, nparams);
  set_ext_params_exx(p, ext_params);
}